

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int type_set_format(coda_type *type,coda_format format)

{
  coda_type_class cVar1;
  coda_type *type_00;
  long lVar2;
  long num_record_fields;
  long local_20;
  
  type->format = format;
  cVar1 = type->type_class;
  if (cVar1 == coda_special_class) {
    type_00 = *(coda_type **)&type[1].type_class;
  }
  else {
    if (cVar1 != coda_array_class) {
      if (cVar1 == coda_record_class) {
        cVar1 = coda_type_get_num_record_fields(type,&local_20);
        for (lVar2 = 0; lVar2 < local_20; lVar2 = lVar2 + 1) {
          cVar1 = type_set_format(*(coda_type **)(*(long *)(type[1].description + lVar2 * 8) + 0x10)
                                  ,format);
        }
      }
      goto LAB_001508e4;
    }
    type_00 = *(coda_type **)(type + 1);
  }
  cVar1 = type_set_format(type_00,format);
LAB_001508e4:
  if (type->attributes != (coda_type_record *)0x0) {
    cVar1 = type_set_format((coda_type *)type->attributes,format);
  }
  return cVar1;
}

Assistant:

static int type_set_format(coda_type *type, coda_format format)
{
    type->format = format;
    switch (type->type_class)
    {
        case coda_record_class:
            {
                long num_record_fields;
                long i;

                coda_type_get_num_record_fields(type, &num_record_fields);
                for (i = 0; i < num_record_fields; i++)
                {
                    type_set_format(((coda_type_record *)type)->field[i]->type, format);
                }
            }
            break;
        case coda_array_class:
            type_set_format(((coda_type_array *)type)->base_type, format);
            break;
        case coda_special_class:
            type_set_format(((coda_type_special *)type)->base_type, format);
            break;
        default:
            break;
    }
    if (type->attributes != NULL)
    {
        type_set_format((coda_type *)type->attributes, format);
    }

    return 0;
}